

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::compressedteximage3d_neg_width_height_depth
               (NegativeTestContext *ctx)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "GL_INVALID_VALUE is generated if width, height or depth is less than 0.","");
  NegativeTestContext::beginSection(ctx,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glCompressedTexImage3D
            (&ctx->super_CallLogWrapper,0x8c1a,0,0x9278,-1,0,0,0,0,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glCompressedTexImage3D
            (&ctx->super_CallLogWrapper,0x8c1a,0,0x9278,0,-1,0,0,0,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glCompressedTexImage3D
            (&ctx->super_CallLogWrapper,0x8c1a,0,0x9278,0,0,-1,0,0,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glCompressedTexImage3D
            (&ctx->super_CallLogWrapper,0x8c1a,0,0x9278,-1,-1,-1,0,0,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void compressedteximage3d_neg_width_height_depth (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_VALUE is generated if width, height or depth is less than 0.");
	ctx.glCompressedTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_COMPRESSED_RGBA8_ETC2_EAC, -1, 0, 0, 0, 0, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCompressedTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_COMPRESSED_RGBA8_ETC2_EAC, 0, -1, 0, 0, 0, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCompressedTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_COMPRESSED_RGBA8_ETC2_EAC, 0, 0, -1, 0, 0, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCompressedTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_COMPRESSED_RGBA8_ETC2_EAC, -1, -1, -1, 0, 0, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();
}